

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

bool __thiscall
MultiAgentDecisionProcessDiscrete::SanityCheck(MultiAgentDecisionProcessDiscrete *this)

{
  uint uVar1;
  ostream *poVar2;
  undefined8 uVar3;
  E *this_00;
  long *in_RDI;
  stringstream ss_5;
  char float_str_1 [30];
  stringstream ss_4;
  stringstream ss_3;
  Index o;
  Index to_1;
  Index a_1;
  Index from_1;
  char float_str [30];
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  Index to;
  Index from;
  Index a;
  bool sane;
  double p;
  double sum;
  size_t nrJO;
  size_t nrS;
  size_t nrJA;
  stringstream *in_stack_fffffffffffff238;
  E *in_stack_fffffffffffff240;
  Index i;
  MADPComponentDiscreteActions *in_stack_fffffffffffff248;
  string local_bd0 [32];
  string local_bb0 [32];
  stringstream local_b90 [16];
  ostream local_b80 [376];
  char local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  stringstream local_988 [16];
  ostream local_978 [376];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  stringstream local_7a0 [16];
  ostream local_790 [376];
  uint local_618;
  uint local_614;
  uint local_610;
  uint local_60c;
  string local_608 [32];
  string local_5e8 [32];
  char local_5c8 [32];
  stringstream local_5a8 [16];
  ostream local_598 [376];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  stringstream local_3c0 [16];
  ostream local_3b0 [376];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [48];
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  uint local_40;
  uint local_3c;
  uint local_38;
  byte local_31;
  double local_30;
  double local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_10 = (**(code **)(*in_RDI + 0x70))();
  local_18 = (**(code **)(*in_RDI + 0x30))();
  local_20 = (**(code **)(*in_RDI + 0xd0))();
  local_31 = 1;
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < local_18; local_3c = local_3c + 1) {
      local_28 = 0.0;
      for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
        local_30 = (double)(**(code **)(*in_RDI + 0x110))(in_RDI,local_3c,local_38,local_40);
        if (local_30 < 0.0) {
          local_31 = 0;
          std::__cxx11::stringstream::stringstream(local_1c8);
          poVar2 = std::operator<<(local_1b8,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
          poVar2 = std::operator<<(poVar2,"failed: negative probability ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
          poVar2 = std::operator<<(poVar2," for p(s\'|s,a)==p(");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                    ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                     (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_1f8);
          poVar2 = std::operator<<(poVar2,"|");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                    ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                     (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_218);
          poVar2 = std::operator<<(poVar2,",");
          MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                    (in_stack_fffffffffffff248,(Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_238);
          std::operator<<(poVar2,")");
          std::__cxx11::string::~string(local_238);
          std::__cxx11::string::~string(local_218);
          std::__cxx11::string::~string(local_1f8);
          uVar3 = __cxa_allocate_exception(0x28);
          E::E(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
          __cxa_throw(uVar3,&E::typeinfo,E::~E);
        }
        uVar1 = std::isnan(local_30);
        if ((uVar1 & 1) != 0) {
          local_31 = 0;
          std::__cxx11::stringstream::stringstream(local_3c0);
          poVar2 = std::operator<<(local_3b0,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
          poVar2 = std::operator<<(poVar2,"failed: NaN ");
          poVar2 = std::operator<<(poVar2," for p(s\'|s,a)==p(");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                    ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                     (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_3e0);
          poVar2 = std::operator<<(poVar2,"|");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                    ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                     (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_400);
          poVar2 = std::operator<<(poVar2,",");
          MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                    (in_stack_fffffffffffff248,(Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
          poVar2 = std::operator<<(poVar2,local_420);
          std::operator<<(poVar2,")");
          std::__cxx11::string::~string(local_420);
          std::__cxx11::string::~string(local_400);
          std::__cxx11::string::~string(local_3e0);
          uVar3 = __cxa_allocate_exception(0x28);
          E::E(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
          __cxa_throw(uVar3,&E::typeinfo,E::~E);
        }
        local_28 = local_30 + local_28;
      }
      if ((1.0000000000005 < local_28) || (local_28 < 0.9999999999995)) {
        local_31 = 0;
        std::__cxx11::stringstream::stringstream(local_5a8);
        sprintf(local_5c8,"%10.10f",local_28);
        poVar2 = std::operator<<(local_598,"MultiAgentDecisionProcessDiscrete::SanityCheck failed:")
        ;
        poVar2 = std::operator<<(poVar2," transition does not sum to 1 but to:\n");
        poVar2 = std::operator<<(poVar2,local_5c8);
        poVar2 = std::operator<<(poVar2,"\n for (s,a)==(");
        MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                  ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                   (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
        poVar2 = std::operator<<(poVar2,local_5e8);
        poVar2 = std::operator<<(poVar2,"[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c);
        poVar2 = std::operator<<(poVar2,"],");
        MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                  (in_stack_fffffffffffff248,(Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
        poVar2 = std::operator<<(poVar2,local_608);
        poVar2 = std::operator<<(poVar2,"[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
        std::operator<<(poVar2,"])");
        std::__cxx11::string::~string(local_608);
        std::__cxx11::string::~string(local_5e8);
        uVar3 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
        __cxa_throw(uVar3,&E::typeinfo,E::~E);
      }
    }
  }
  for (local_60c = 0; local_60c < local_18; local_60c = local_60c + 1) {
    for (local_610 = 0; local_610 < local_10; local_610 = local_610 + 1) {
      for (local_614 = 0; local_614 < local_18; local_614 = local_614 + 1) {
        local_28 = 0.0;
        for (local_618 = 0; local_618 < local_20; local_618 = local_618 + 1) {
          if ((*(byte *)((long)in_RDI + 0x1e2) & 1) == 0) {
            local_30 = (double)(**(code **)(*in_RDI + 0x128))(in_RDI,local_610,local_614,local_618);
          }
          else {
            local_30 = (double)(**(code **)(*in_RDI + 0x130))
                                         (in_RDI,local_60c,local_610,local_614,local_618);
          }
          if (local_30 < 0.0) {
            std::__cxx11::stringstream::stringstream(local_7a0);
            poVar2 = std::operator<<(local_790,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
            poVar2 = std::operator<<(poVar2,"failed: negative probability ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
            poVar2 = std::operator<<(poVar2," for p(o|s\',a)==p(");
            MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                      ((MADPComponentDiscreteObservations *)in_stack_fffffffffffff248,
                       (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_7c0);
            poVar2 = std::operator<<(poVar2,"|");
            MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                      ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                       (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_7e0);
            poVar2 = std::operator<<(poVar2,",");
            MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                      (in_stack_fffffffffffff248,(Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_800);
            std::operator<<(poVar2,")");
            std::__cxx11::string::~string(local_800);
            std::__cxx11::string::~string(local_7e0);
            std::__cxx11::string::~string(local_7c0);
            uVar3 = __cxa_allocate_exception(0x28);
            E::E(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
            __cxa_throw(uVar3,&E::typeinfo,E::~E);
          }
          uVar1 = std::isnan(local_30);
          if ((uVar1 & 1) != 0) {
            std::__cxx11::stringstream::stringstream(local_988);
            poVar2 = std::operator<<(local_978,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
            poVar2 = std::operator<<(poVar2,"failed: NaN for p(o|s\',a)==p(");
            MADPComponentDiscreteObservations::GetJointObservationName_abi_cxx11_
                      ((MADPComponentDiscreteObservations *)in_stack_fffffffffffff248,
                       (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_9a8);
            poVar2 = std::operator<<(poVar2,"|");
            MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                      ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,
                       (Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_9c8);
            poVar2 = std::operator<<(poVar2,",");
            MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_
                      (in_stack_fffffffffffff248,(Index)((ulong)in_stack_fffffffffffff240 >> 0x20));
            poVar2 = std::operator<<(poVar2,local_9e8);
            std::operator<<(poVar2,")");
            std::__cxx11::string::~string(local_9e8);
            std::__cxx11::string::~string(local_9c8);
            std::__cxx11::string::~string(local_9a8);
            uVar3 = __cxa_allocate_exception(0x28);
            E::E(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
            __cxa_throw(uVar3,&E::typeinfo,E::~E);
          }
          local_28 = local_30 + local_28;
        }
        if ((1.0000000000005 < local_28) || (local_28 < 0.9999999999995)) {
          sprintf(local_a08,"%10.10f",local_28);
          i = (Index)((ulong)in_stack_fffffffffffff240 >> 0x20);
          local_31 = 0;
          std::__cxx11::stringstream::stringstream(local_b90);
          poVar2 = std::operator<<(local_b80,"MultiAgentDecisionProcessDiscrete::SanityCheck ");
          poVar2 = std::operator<<(poVar2,"failed: observation does not sum to 1 but to \n");
          poVar2 = std::operator<<(poVar2,local_a08);
          poVar2 = std::operator<<(poVar2,"\n for (s\',a)==(");
          MADPComponentDiscreteStates::GetStateName_abi_cxx11_
                    ((MADPComponentDiscreteStates *)in_stack_fffffffffffff248,i);
          poVar2 = std::operator<<(poVar2,local_bb0);
          poVar2 = std::operator<<(poVar2,"[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_614);
          poVar2 = std::operator<<(poVar2,"],");
          MADPComponentDiscreteActions::GetJointActionName_abi_cxx11_(in_stack_fffffffffffff248,i);
          poVar2 = std::operator<<(poVar2,local_bd0);
          poVar2 = std::operator<<(poVar2,"[");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_610);
          std::operator<<(poVar2,"])");
          std::__cxx11::string::~string(local_bd0);
          std::__cxx11::string::~string(local_bb0);
          this_00 = (E *)__cxa_allocate_exception(0x28);
          E::E(this_00,in_stack_fffffffffffff238);
          __cxa_throw(this_00,&E::typeinfo,E::~E);
        }
      }
    }
    if ((*(byte *)((long)in_RDI + 0x1e2) & 1) == 0) break;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool MultiAgentDecisionProcessDiscrete::SanityCheck()
{
    size_t nrJA=GetNrJointActions(),
          nrS=GetNrStates(),
          nrJO=GetNrJointObservations();

    double sum,p;
    bool sane=true;

    // check transition model
    for(Index a=0;a<nrJA;a++)
    {
        for(Index from=0;from<nrS;from++)
        {
            sum=0.0;
            for(Index to=0;to<nrS;to++)
            {
                p=GetTransitionProbability(from,a,to);
                if(p<0)
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: negative probability " << p << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    sane=false;
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "<<
                        "failed: NaN " << 
                        " for p(s'|s,a)==p(" << _m_S.GetStateName(to) << "|" << 
                        _m_S.GetStateName(from)<<"," << _m_A.GetJointActionName(a) << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                sane=false;
                stringstream ss;
                //string float_str;
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck failed:"<<
                   " transition does not sum to 1 but to:\n" << float_str << 
                   "\n for (s,a)==(" << _m_S.GetStateName(from) << "[" << from << 
                   "]," << _m_A.GetJointActionName(a) << "[" << a << "])";
                throw E(ss);
            }
        }
    }

    // check observation model

    for(Index from=0;from<nrS;from++)
    {
      for(Index a=0;a<nrJA;a++)
      {
        for(Index to=0;to<nrS;to++)
        {
            sum=0;
            for(Index o=0;o<nrJO;o++)
            {
	        if(_m_eventObservability)
	            p=GetObservationProbability(from,a,to,o);
		else
		    p=GetObservationProbability(a,to,o);
                if(p<0)
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: negative probability " << p 
                       << " for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                if(std::isnan(p))
                {
                    stringstream ss;
                    ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                       << "failed: NaN for p(o|s',a)==p(" 
                       << _m_O.GetJointObservationName(o)
                       << "|" << _m_S.GetStateName(to) 
                       << "," 
                       << _m_A.GetJointActionName(a) 
                       << ")";
                    throw E(ss);
                }
                sum+=p;
            }
            if((sum>(1.0 + PROB_PRECISION/2)) ||
               (sum < (1.0 - PROB_PRECISION/2)))
            {
                char float_str[30];
                sprintf(float_str, "%10.10f", sum);
                sane=false;
                stringstream ss;
                ss << "MultiAgentDecisionProcessDiscrete::SanityCheck "
                   << "failed: observation does not sum to 1 but to \n" 
                   << float_str << "\n for (s',a)==(" << _m_S.GetStateName(to) 
                   << "[" << to << "],"
                   << _m_A.GetJointActionName(a) 
                   << "[" << a << "])";
                throw E(ss);
            }
        }
      }
      if(!_m_eventObservability) break;
    }

    return(sane);
}